

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O0

int __thiscall ConditionalEstimator::init(ConditionalEstimator *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int local_28;
  int local_24;
  int j;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  ConditionalEstimator *this_local;
  
  this->bRejection = false;
  (this->super_Estimator).nSamples = 0;
  if (((this->super_Estimator).nEstimate & 4U) != 0) {
    for (i_2 = 0; i_2 < this->nPre + this->nPost + 1; i_2 = i_2 + 1) {
      this->aOne[i_2] = 0.0;
    }
  }
  if (((this->super_Estimator).nEstimate & 0x20U) != 0) {
    for (i_3 = 0; i_3 < this->nPre + this->nPost + 1; i_3 = i_3 + 1) {
      this->aEvents[i_3] = 0.0;
    }
  }
  if (((this->super_Estimator).nEstimate & 8U) != 0) {
    for (i_4 = 0; i_4 < this->nPre + this->nPost + 1; i_4 = i_4 + 1) {
      this->aTwo[i_4] = 0.0;
    }
  }
  if (((this->super_Estimator).nEstimate & 0x10U) != 0) {
    for (j = 0; j < this->nPre + this->nPost + 1; j = j + 1) {
      this->aThree[j] = 0.0;
    }
  }
  if (((this->super_Estimator).nEstimate & 2U) != 0) {
    for (local_24 = 0; local_24 < this->nPre + this->nPost + 1; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < this->nDist; local_28 = local_28 + 1) {
        this->aDist[local_24][local_28] = 0.0;
      }
    }
  }
  Ring<double>::clear(&this->condSampleRing);
  Ring<bool>::clear(&this->condEventRing);
  return extraout_EAX;
}

Assistant:

void ConditionalEstimator::init()
{
	bRejection = false;
	nSamples = 0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<nPre+nPost+1; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_EVENTS)
		for(int i=0; i<nPre+nPost+1; i++)
			aEvents[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<nPre+nPost+1; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<nPre+nPost+1; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		for( int i=0; i<nPre+nPost+1; i++ )
			for( int j=0; j<nDist; j++ )
				aDist[i][j] = 0.0;
	}
	condSampleRing.clear();
	condEventRing.clear();
}